

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O2

void test_2d_mixed_SD<15ul,30ul>(void)

{
  pointer ptVar1;
  reference pvVar2;
  _Head_base<0UL,_int,_false> *t;
  _Head_base<1UL,_int,_false> local_68;
  _Head_base<0UL,_int,_false> local_64;
  value_type true_idx;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> data;
  tuple<int,_int> *local_40;
  pointer local_38;
  
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.
                         super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xdb,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)data.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xdd,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)data.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xde,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xe0,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf;
  true_idx = 0xf;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xe1,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1c2;
  true_idx = 0x1c2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xe3,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1c2;
  true_idx = 0x1c2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0xe4,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(unsigned_long *)&data,&true_idx);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            (&data,0x1c2,(allocator_type *)&true_idx);
  ptVar1 = data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (local_68._M_head_impl = 0; (uint)local_68._M_head_impl < 0x1e;
      local_68._M_head_impl = local_68._M_head_impl + 1) {
    for (local_64._M_head_impl = 0; (uint)local_64._M_head_impl < 0xf;
        local_64._M_head_impl = local_64._M_head_impl + 1) {
      true_idx = (long)local_68._M_head_impl * 0xf + (ulong)(uint)local_64._M_head_impl;
      local_40 = (tuple<int,_int> *)true_idx;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xef,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(unsigned_long *)&local_40,
                 &true_idx);
      local_40 = ptVar1 + (long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl;
      local_38 = ptVar1 + true_idx;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xf1,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",&local_40,&local_38);
      t = &ptVar1[(long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl].
           super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
      t->_M_head_impl = local_64._M_head_impl;
      ptVar1[(long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl].
      super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>
      ._M_head_impl = local_68._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xf6,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",&t->_M_head_impl,
                 &local_64._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xf7,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",
                 (int *)(ptVar1 + (long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl),
                 &local_68._M_head_impl);
      pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                         (&data,(long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(data.at(l.index(i, j))))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xfa,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",
                 &(pvVar2->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
                  _M_head_impl,&local_64._M_head_impl);
      pvVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                         (&data,(long)local_68._M_head_impl * 0xf + (long)local_64._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(data.at(l.index(i, j))))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xfb,"void test_2d_mixed_SD() [X = 15UL, Y = 30UL]",(int *)pvVar2,
                 &local_68._M_head_impl);
    }
  }
  std::_Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~_Vector_base
            (&data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>)
  ;
  return;
}

Assistant:

void test_2d_mixed_SD()
{ // {{{
    layout_mapping_left<
        dimensions<X, dyn>, dimensions<1, 1>, dimensions<0, 0>
    > const l(Y);

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    vector<tuple<int, int> > data(l[0] * l[1]);
    tuple<int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j)))), j); 
    }
}